

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::TimeZoneFormat::parseShortZoneID
          (TimeZoneFormat *this,UnicodeString *text,ParsePosition *pos,UnicodeString *tzID)

{
  short sVar1;
  int32_t start;
  _func_int **srcChars;
  UBool UVar2;
  int iVar3;
  StringEnumeration *pSVar4;
  TextTrieMapSearchResultHandler *handler;
  TextTrieMap *this_00;
  undefined4 extraout_var;
  UChar *value;
  UChar *key;
  undefined4 extraout_var_00;
  int32_t length;
  UnicodeString *size;
  UErrorCode status;
  UErrorCode local_3c;
  UnicodeString *local_38;
  UnicodeString *tzid;
  
  local_3c = U_ZERO_ERROR;
  size = text;
  if ((gShortZoneIdTrieInitOnce == 2) ||
     (UVar2 = umtx_initImplPreInit((UInitOnce *)&gShortZoneIdTrieInitOnce), UVar2 == '\0')) {
    if (U_ZERO_ERROR < DAT_003baa9c) {
      local_3c = DAT_003baa9c;
    }
  }
  else {
    local_38 = text;
    ucln_i18n_registerCleanup_63(UCLN_I18N_TIMEZONEFORMAT,tzfmt_cleanup);
    size = (UnicodeString *)0x0;
    pSVar4 = TimeZone::createTimeZoneIDEnumeration
                       (UCAL_ZONE_TYPE_CANONICAL,(char *)0x0,(int32_t *)0x0,&stack0xffffffffffffffc4
                       );
    if (local_3c < U_ILLEGAL_ARGUMENT_ERROR) {
      this_00 = (TextTrieMap *)UMemory::operator_new((UMemory *)0x38,(size_t)size);
      if (this_00 == (TextTrieMap *)0x0) {
        this_00 = (TextTrieMap *)0x0;
      }
      else {
        size = (UnicodeString *)0x1;
        TextTrieMap::TextTrieMap(this_00,'\x01',(UObjectDeleter *)0x0);
      }
      gShortZoneIdTrie = this_00;
      if (this_00 == (TextTrieMap *)0x0) {
        local_3c = U_MEMORY_ALLOCATION_ERROR;
      }
      else {
        size = (UnicodeString *)&stack0xffffffffffffffc4;
        iVar3 = (*(pSVar4->super_UObject)._vptr_UObject[7])(pSVar4);
        tzid = (UnicodeString *)CONCAT44(extraout_var,iVar3);
        if (tzid != (UnicodeString *)0x0) {
          do {
            value = ZoneMeta::findTimeZoneID(tzid);
            key = ZoneMeta::getShortID(tzid);
            if (value != (UChar *)0x0 && key != (UChar *)0x0) {
              TextTrieMap::put(gShortZoneIdTrie,key,value,&stack0xffffffffffffffc4);
            }
            size = (UnicodeString *)&stack0xffffffffffffffc4;
            iVar3 = (*(pSVar4->super_UObject)._vptr_UObject[7])(pSVar4);
            tzid = (UnicodeString *)CONCAT44(extraout_var_00,iVar3);
          } while (tzid != (UnicodeString *)0x0);
        }
      }
    }
    if (pSVar4 != (StringEnumeration *)0x0) {
      (*(pSVar4->super_UObject)._vptr_UObject[1])(pSVar4);
    }
    DAT_003baa9c = local_3c;
    umtx_initImplPostInit((UInitOnce *)&gShortZoneIdTrieInitOnce);
    text = local_38;
  }
  start = pos->index;
  UnicodeString::setToBogus(tzID);
  iVar3 = 0;
  if (local_3c < U_ILLEGAL_ARGUMENT_ERROR) {
    handler = (TextTrieMapSearchResultHandler *)UMemory::operator_new((UMemory *)0x18,(size_t)size);
    if (handler == (TextTrieMapSearchResultHandler *)0x0) {
      handler = (TextTrieMapSearchResultHandler *)0x0;
    }
    else {
      handler->_vptr_TextTrieMapSearchResultHandler = (_func_int **)&PTR_handleMatch_003a6e48;
      *(undefined4 *)&handler[1]._vptr_TextTrieMapSearchResultHandler = 0;
      handler[2]._vptr_TextTrieMapSearchResultHandler = (_func_int **)0x0;
    }
    TextTrieMap::search(gShortZoneIdTrie,text,start,handler,&stack0xffffffffffffffc4);
    iVar3 = *(int *)&handler[1]._vptr_TextTrieMapSearchResultHandler;
    if (0 < iVar3) {
      srcChars = handler[2]._vptr_TextTrieMapSearchResultHandler;
      UnicodeString::unBogus(tzID);
      sVar1 = (tzID->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        length = (tzID->fUnion).fFields.fLength;
      }
      else {
        length = (int)sVar1 >> 5;
      }
      UnicodeString::doReplace(tzID,0,length,(UChar *)srcChars,0,-1);
    }
    if (handler != (TextTrieMapSearchResultHandler *)0x0) {
      (*handler->_vptr_TextTrieMapSearchResultHandler[2])(handler);
    }
  }
  if (iVar3 < 1) {
    pos->errorIndex = start;
  }
  else {
    pos->index = iVar3 + start;
  }
  return tzID;
}

Assistant:

UnicodeString&
TimeZoneFormat::parseShortZoneID(const UnicodeString& text, ParsePosition& pos, UnicodeString& tzID) const {
    UErrorCode status = U_ZERO_ERROR;
    umtx_initOnce(gShortZoneIdTrieInitOnce, &initShortZoneIdTrie, status);

    int32_t start = pos.getIndex();
    int32_t len = 0;
    tzID.setToBogus();

    if (U_SUCCESS(status)) {
        LocalPointer<ZoneIdMatchHandler> handler(new ZoneIdMatchHandler());
        gShortZoneIdTrie->search(text, start, handler.getAlias(), status); 
        len = handler->getMatchLen();
        if (len > 0) {
            tzID.setTo(handler->getID(), -1);
        }
    }

    if (len > 0) {
        pos.setIndex(start + len);
    } else {
        pos.setErrorIndex(start);
    }

    return tzID;
}